

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Ok> *
wasm::WATParser::makeCallIndirect<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool isReturn)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  _Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *table_00;
  undefined1 local_d0 [8];
  MaybeResult<wasm::Name> table;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_88;
  undefined1 local_80 [8];
  Result<wasm::HeapType> type;
  Result<wasm::HeapType> _val_1;
  
  local_88 = annotations;
  maybeTableidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)local_d0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_80,
                  (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_d0);
  if (type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x02') {
    puVar1 = (undefined1 *)
             ((long)&_val_1.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
    type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),local_80,
               (long)type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                     super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first.
                     _M_storage.id + (long)local_80);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
    if ((undefined1 *)
        type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_ == puVar1) {
      *puVar2 = _val_1.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           _val_1.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           _val_1.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_8_;
    }
    ((_Uninitialized<wasm::HeapType,_true> *)
    ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->_M_storage =
         (HeapType)
         _val_1.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
         super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
         super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
         super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
         super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
         super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_80);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_80);
    typeuse<wasm::WATParser::ParseDefsCtx>((Result<wasm::HeapType> *)local_80,ctx,false);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)
               ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)local_80);
    if (_val_1.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x01') {
      table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = &local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20),
                 type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_,
                 (long)_val_1.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first.
                       _M_storage.id +
                 type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if ((undefined8 *)
          table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ == &local_98) {
        *puVar2 = local_98;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_90;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_98;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_a0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                                super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                                super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
      table_00 = (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)0x0;
      if (table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0') {
        table_00 = (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_d0;
      }
      ParseDefsCtx::makeCallIndirect
                (__return_storage_ptr__,ctx,pos,local_88,(Name *)table_00,(HeapType)local_80,
                 isReturn);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_80);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeCallIndirect(Ctx& ctx,
                          Index pos,
                          const std::vector<Annotation>& annotations,
                          bool isReturn) {
  auto table = maybeTableidx(ctx);
  CHECK_ERR(table);
  auto type = typeuse(ctx, false);
  CHECK_ERR(type);
  return ctx.makeCallIndirect(
    pos, annotations, table.getPtr(), *type, isReturn);
}